

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O1

void __thiscall sysapi::epoll::modify(epoll *this,int fd,uint32_t events,epoll_registration *reg)

{
  int iVar1;
  int *piVar2;
  epoll_event ev;
  undefined1 local_20 [16];
  
  local_20._0_4_ = events;
  local_20._4_8_ = reg;
  iVar1 = weak_file_descriptor::getfd((weak_file_descriptor *)this);
  iVar1 = epoll_ctl(iVar1,3,fd,(epoll_event *)local_20);
  if (-1 < iVar1) {
    return;
  }
  piVar2 = __errno_location();
  throw_error(*piVar2,"epoll_ctl(EPOLL_CTL_MOD)");
}

Assistant:

void epoll::modify(int fd, uint32_t events, epoll_registration* reg)
{
    epoll_event ev = {0, 0};
    ev.data.ptr = reg;
    ev.events   = events;

    int r = ::epoll_ctl(fd_.getfd(), EPOLL_CTL_MOD, fd, &ev);
    if (r < 0)
        throw_error(errno, "epoll_ctl(EPOLL_CTL_MOD)");
}